

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderOptimizationTests.cpp
# Opt level: O1

ProgramData * __thiscall
deqp::gles2::Performance::anon_unknown_1::CommonSubexpressionCase::generateProgramData
          (ProgramData *__return_storage_ptr__,CommonSubexpressionCase *this,bool optimized)

{
  CaseShaderType CVar1;
  long lVar2;
  undefined8 *puVar3;
  long *plVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  undefined8 uVar6;
  long *plVar7;
  ulong *puVar8;
  size_type *psVar9;
  int iVar10;
  ulong uVar11;
  char *pcVar12;
  _Alloc_hider _Var13;
  uint uVar14;
  size_type __dnew_1;
  string statements;
  size_type __dnew;
  string local_3a0;
  string local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  string local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  string local_2e0;
  string local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  string local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  uint local_23c;
  ulong *local_238;
  long local_230;
  ulong local_228 [2];
  ulong *local_218;
  long local_210;
  ulong local_208 [2];
  undefined8 **local_1f8;
  long local_1f0;
  undefined8 *local_1e8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  ProgramData *local_1b8;
  CommonSubexpressionCase *local_1b0;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  CVar1 = (this->super_ShaderOptimizationCase).m_caseShaderType;
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  local_1b8 = __return_storage_ptr__;
  local_1b0 = this;
  if (CVar1 == CASESHADERTYPE_FRAGMENT) {
    pcVar12 = local_260.field_2._M_local_buf + 7;
    local_260.field_2._M_local_buf[4] = 'u';
    local_260.field_2._M_allocated_capacity._5_2_ = 0x706d;
    local_260.field_2._M_allocated_capacity._0_4_ = 0x6964656d;
    local_260._M_string_length = 7;
  }
  else {
    if (CVar1 != CASESHADERTYPE_VERTEX) {
      std::__throw_logic_error("basic_string::_M_construct null not valid");
      goto switchD_0103d58e_default;
    }
    pcVar12 = local_260.field_2._M_local_buf + 5;
    local_260.field_2._M_local_buf[4] = 'p';
    local_260.field_2._M_allocated_capacity._0_4_ = 0x68676968;
    local_260._M_string_length = 5;
  }
  *pcVar12 = '\0';
  switch(this->m_caseType) {
  case CASETYPE_SINGLE_STATEMENT:
    iVar10 = (uint)(CVar1 == CASESHADERTYPE_VERTEX) * 3 + 1;
    if (optimized) {
      std::operator+(&local_2a0,"\t",&local_260);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_2a0);
      local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
      plVar7 = plVar4 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar7) {
        lVar2 = *plVar7;
        local_320.field_2._M_local_buf[0] = (char)lVar2;
        local_320.field_2._M_allocated_capacity._1_6_ = (undefined6)((ulong)lVar2 >> 8);
        local_320.field_2._M_local_buf[7] = (char)((ulong)lVar2 >> 0x38);
        local_320.field_2._8_7_ = (undefined7)plVar4[3];
        local_320.field_2._M_local_buf[0xf] = (char)((ulong)plVar4[3] >> 0x38);
      }
      else {
        lVar2 = *plVar7;
        local_320.field_2._M_local_buf[0] = (char)lVar2;
        local_320.field_2._M_allocated_capacity._1_6_ = (undefined6)((ulong)lVar2 >> 8);
        local_320.field_2._M_local_buf[7] = (char)((ulong)lVar2 >> 0x38);
        local_320._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_320._M_string_length = plVar4[1];
      *plVar4 = (long)plVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      puVar3 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_320,(ulong)local_260._M_dataplus._M_p)
      ;
      local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
      pcVar12 = (char *)(puVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar12) {
        local_300.field_2._M_allocated_capacity._0_7_ = (undefined7)*(undefined8 *)pcVar12;
        local_300.field_2._M_local_buf[7] = (char)((ulong)*(undefined8 *)pcVar12 >> 0x38);
        local_300.field_2._8_7_ = (undefined7)puVar3[3];
        local_300.field_2._M_local_buf[0xf] = (char)((ulong)puVar3[3] >> 0x38);
      }
      else {
        local_300.field_2._M_allocated_capacity._0_7_ = (undefined7)*(undefined8 *)pcVar12;
        local_300.field_2._M_local_buf[7] = (char)((ulong)*(undefined8 *)pcVar12 >> 0x38);
        local_300._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_300._M_string_length = puVar3[1];
      *puVar3 = pcVar12;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_300);
      local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
      pcVar12 = (char *)(puVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar12) {
        local_360.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_360.field_2._8_8_ = puVar3[3];
      }
      else {
        local_360.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_360._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_360._M_string_length = puVar3[1];
      *puVar3 = pcVar12;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      puVar3 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_360,(ulong)local_260._M_dataplus._M_p)
      ;
      local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
      pcVar12 = (char *)(puVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar12) {
        local_340.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_340.field_2._8_8_ = puVar3[3];
      }
      else {
        local_340.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_340._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_340._M_string_length = puVar3[1];
      *puVar3 = pcVar12;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_340);
      pcVar12 = (char *)(puVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar12) {
        local_3a0.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_3a0.field_2._8_8_ = puVar3[3];
        local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
      }
      else {
        local_3a0.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_3a0._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_3a0._M_string_length = puVar3[1];
      *puVar3 = pcVar12;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
      local_280.field_2._M_allocated_capacity._0_2_ = 100;
      local_280._M_string_length = 1;
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      local_1d8.field_2._M_allocated_capacity._0_2_ = 0x2b;
      local_1d8._M_string_length = 1;
      repeat(&local_2c0,&local_280,iVar10,&local_1d8);
      uVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
        uVar6 = local_3a0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar6 < (char *)(local_2c0._M_string_length + local_3a0._M_string_length)) {
        uVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
          uVar6 = local_2c0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar6 < (char *)(local_2c0._M_string_length + local_3a0._M_string_length))
        goto LAB_0103f682;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_2c0,0,(char *)0x0,(ulong)local_3a0._M_dataplus._M_p);
      }
      else {
LAB_0103f682:
        puVar3 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_3a0,(ulong)local_2c0._M_dataplus._M_p);
      }
      local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
      pcVar12 = (char *)(puVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar12) {
        local_380.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_380.field_2._8_8_ = puVar3[3];
      }
      else {
        local_380.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_380._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_380._M_string_length = puVar3[1];
      *puVar3 = pcVar12;
      puVar3[1] = 0;
      *pcVar12 = '\0';
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_380);
    }
    else {
      local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
      local_1a8[0]._M_dataplus._M_p = (pointer)0x4d;
      paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)std::__cxx11::string::_M_create((ulong *)&local_340,(ulong)local_1a8);
      _Var13._M_p = local_1a8[0]._M_dataplus._M_p;
      local_340.field_2._M_allocated_capacity = (size_type)local_1a8[0]._M_dataplus._M_p;
      local_340._M_dataplus._M_p = (pointer)paVar5;
      memcpy(paVar5,"fract(sin(value) + cos(sin(value))) + sqrt(sin(value) + exp(cos(sin(value))))",
             0x4d);
      local_340._M_string_length = (size_type)_Var13._M_p;
      paVar5->_M_local_buf[(long)_Var13._M_p] = '\0';
      local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
      local_360.field_2._M_allocated_capacity = 0x202020202020090a;
      local_360._M_string_length = 10;
      local_360.field_2._8_3_ = 0x202b;
      repeat(&local_3a0,&local_340,iVar10,&local_360);
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_3a0,0,(char *)0x0,0x1c2b3ee);
      local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
      pcVar12 = (char *)(puVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar12) {
        local_380.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_380.field_2._8_8_ = puVar3[3];
      }
      else {
        local_380.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_380._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_380._M_string_length = puVar3[1];
      *puVar3 = pcVar12;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_380);
    }
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    puVar8 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_2e0.field_2._M_allocated_capacity = *puVar8;
      local_2e0.field_2._8_8_ = puVar3[3];
    }
    else {
      local_2e0.field_2._M_allocated_capacity = *puVar8;
      local_2e0._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_2e0._M_string_length = puVar3[1];
    *puVar3 = puVar8;
    puVar3[1] = 0;
    *(undefined1 *)puVar8 = 0;
    if (!optimized) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._M_dataplus._M_p != &local_380.field_2) {
        operator_delete(local_380._M_dataplus._M_p,
                        (ulong)(local_380.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
        operator_delete(local_3a0._M_dataplus._M_p,
                        (ulong)(local_3a0.field_2._M_allocated_capacity + 1));
      }
      uVar6 = local_360.field_2._M_allocated_capacity;
      _Var13._M_p = local_360._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) goto LAB_0103ff9d;
      goto LAB_0103ffa5;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,
                      (ulong)(local_380.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,
                      (ulong)(local_2c0.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,
                      CONCAT62(local_1d8.field_2._M_allocated_capacity._2_6_,
                               local_1d8.field_2._M_allocated_capacity._0_2_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,
                      (ulong)(local_280.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p,
                      (ulong)(local_3a0.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,
                      (ulong)(local_340.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,
                      (ulong)(local_360.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      uVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT17(local_300.field_2._M_local_buf[7],
                          local_300.field_2._M_allocated_capacity._0_7_);
      _Var13._M_p = local_300._M_dataplus._M_p;
LAB_01040083:
      operator_delete(_Var13._M_p,(ulong)(uVar6 + 1));
    }
LAB_0104008b:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,
                      CONCAT17(local_320.field_2._M_local_buf[7],
                               CONCAT61(local_320.field_2._M_allocated_capacity._1_6_,
                                        local_320.field_2._M_local_buf[0])) + 1);
    }
    uVar6 = local_2a0.field_2._M_allocated_capacity;
    _Var13._M_p = local_2a0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p == &local_2a0.field_2) goto LAB_010400cd;
    break;
  case CASETYPE_MULTIPLE_STATEMENTS:
    iVar10 = (uint)(CVar1 == CASESHADERTYPE_VERTEX) * 2 + 2;
    if (optimized) {
      std::operator+(&local_360,"\t",&local_260);
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_360);
      local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
      pcVar12 = (char *)(puVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar12) {
        local_340.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_340.field_2._8_8_ = puVar3[3];
      }
      else {
        local_340.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_340._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_340._M_string_length = puVar3[1];
      *puVar3 = pcVar12;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      puVar3 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_340,(ulong)local_260._M_dataplus._M_p)
      ;
      local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
      pcVar12 = (char *)(puVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar12) {
        local_3a0.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_3a0.field_2._8_8_ = puVar3[3];
      }
      else {
        local_3a0.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_3a0._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_3a0._M_string_length = puVar3[1];
      *puVar3 = pcVar12;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_3a0);
      pcVar12 = (char *)(puVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar12) {
        local_380.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_380.field_2._8_8_ = puVar3[3];
        local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
      }
      else {
        local_380.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_380._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_380._M_string_length = puVar3[1];
      *puVar3 = pcVar12;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
      local_320.field_2._M_local_buf[0] = '\t';
      local_320.field_2._M_allocated_capacity._1_6_ = 0x2065756c6176;
      local_320.field_2._M_local_buf[7] = '+';
      local_320.field_2._8_7_ = 0xa3b622a61203d;
      local_320._M_string_length = 0xf;
      local_320.field_2._M_local_buf[0xf] = '\0';
      local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
      local_2a0._M_string_length = 0;
      local_2a0.field_2._M_allocated_capacity =
           local_2a0.field_2._M_allocated_capacity & 0xffffffffffffff00;
      repeat(&local_300,&local_320,iVar10,&local_2a0);
      uVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._M_dataplus._M_p != &local_380.field_2) {
        uVar6 = local_380.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar6 < (char *)(local_380._M_string_length + local_300._M_string_length)) {
        pcVar12 = (char *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300._M_dataplus._M_p != &local_300.field_2) {
          pcVar12 = (char *)CONCAT17(local_300.field_2._M_local_buf[7],
                                     local_300.field_2._M_allocated_capacity._0_7_);
        }
        if ((char *)(local_380._M_string_length + local_300._M_string_length) <= pcVar12) {
          puVar3 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_300,0,(char *)0x0,(ulong)local_380._M_dataplus._M_p);
          goto LAB_0103fa52;
        }
      }
      puVar3 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_380,(ulong)local_300._M_dataplus._M_p)
      ;
    }
    else {
      std::operator+(&local_300,"\t",&local_260);
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_300);
      local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
      pcVar12 = (char *)(puVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar12) {
        local_360.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_360.field_2._8_8_ = puVar3[3];
      }
      else {
        local_360.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_360._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_360._M_string_length = puVar3[1];
      *puVar3 = pcVar12;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      puVar3 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_360,(ulong)local_260._M_dataplus._M_p)
      ;
      local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
      pcVar12 = (char *)(puVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar12) {
        local_340.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_340.field_2._8_8_ = puVar3[3];
      }
      else {
        local_340.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_340._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_340._M_string_length = puVar3[1];
      *puVar3 = pcVar12;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_340);
      local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
      pcVar12 = (char *)(puVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar12) {
        local_3a0.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_3a0.field_2._8_8_ = puVar3[3];
      }
      else {
        local_3a0.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_3a0._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_3a0._M_string_length = puVar3[1];
      *puVar3 = pcVar12;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
      local_320._M_string_length = 0;
      local_320.field_2._M_local_buf[0] = '\0';
      repeatIndexedTemplate(&local_380,&local_3a0,iVar10,&local_320,0);
      local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
      local_1a8[0]._M_dataplus._M_p = (pointer)0x1b;
      local_2c0._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_2c0,(ulong)local_1a8);
      local_2c0.field_2._M_allocated_capacity = (size_type)local_1a8[0]._M_dataplus._M_p;
      builtin_strncpy((char *)((long)local_2c0._M_dataplus._M_p + 0xb),"${NDX}*b",8);
      builtin_strncpy((char *)((long)local_2c0._M_dataplus._M_p + 0x13),"${NDX};\n",8);
      *(undefined8 *)local_2c0._M_dataplus._M_p = 0x2b2065756c617609;
      *(undefined8 *)((long)local_2c0._M_dataplus._M_p + 8) = 0x58444e7b2461203d;
      local_2c0._M_string_length = (size_type)local_1a8[0]._M_dataplus._M_p;
      local_2c0._M_dataplus._M_p[(long)local_1a8[0]._M_dataplus._M_p] = '\0';
      local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
      local_280._M_string_length = 0;
      local_280.field_2._M_allocated_capacity =
           local_280.field_2._M_allocated_capacity & 0xffffffffffffff00;
      repeatIndexedTemplate(&local_2a0,&local_2c0,iVar10,&local_280,0);
      uVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._M_dataplus._M_p != &local_380.field_2) {
        uVar6 = local_380.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar6 < (char *)(local_380._M_string_length + local_2a0._M_string_length)) {
        uVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
          uVar6 = local_2a0.field_2._M_allocated_capacity;
        }
        if ((char *)(local_380._M_string_length + local_2a0._M_string_length) <= (ulong)uVar6) {
          puVar3 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_2a0,0,(char *)0x0,(ulong)local_380._M_dataplus._M_p);
          goto LAB_0103fa52;
        }
      }
      puVar3 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_380,(ulong)local_2a0._M_dataplus._M_p)
      ;
    }
LAB_0103fa52:
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    puVar8 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_2e0.field_2._M_allocated_capacity = *puVar8;
      local_2e0.field_2._8_8_ = puVar3[3];
    }
    else {
      local_2e0.field_2._M_allocated_capacity = *puVar8;
      local_2e0._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_2e0._M_string_length = puVar3[1];
    *puVar3 = puVar8;
    puVar3[1] = 0;
    *(undefined1 *)puVar8 = 0;
    if (optimized) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,
                        CONCAT17(local_300.field_2._M_local_buf[7],
                                 local_300.field_2._M_allocated_capacity._0_7_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
        operator_delete(local_2a0._M_dataplus._M_p,
                        (ulong)(local_2a0.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p,
                        CONCAT17(local_320.field_2._M_local_buf[7],
                                 CONCAT61(local_320.field_2._M_allocated_capacity._1_6_,
                                          local_320.field_2._M_local_buf[0])) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._M_dataplus._M_p != &local_380.field_2) {
        operator_delete(local_380._M_dataplus._M_p,
                        (ulong)(local_380.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
        operator_delete(local_3a0._M_dataplus._M_p,
                        (ulong)(local_3a0.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != &local_340.field_2) {
        operator_delete(local_340._M_dataplus._M_p,
                        (ulong)(local_340.field_2._M_allocated_capacity + 1));
      }
      uVar6 = local_360.field_2._M_allocated_capacity;
      _Var13._M_p = local_360._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p == &local_360.field_2) goto LAB_010400cd;
    }
    else {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
        operator_delete(local_2a0._M_dataplus._M_p,
                        (ulong)(local_2a0.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        operator_delete(local_280._M_dataplus._M_p,
                        (ulong)(local_280.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        operator_delete(local_2c0._M_dataplus._M_p,
                        (ulong)(local_2c0.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._M_dataplus._M_p != &local_380.field_2) {
        operator_delete(local_380._M_dataplus._M_p,
                        (ulong)(local_380.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p,
                        CONCAT17(local_320.field_2._M_local_buf[7],
                                 CONCAT61(local_320.field_2._M_allocated_capacity._1_6_,
                                          local_320.field_2._M_local_buf[0])) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
        operator_delete(local_3a0._M_dataplus._M_p,
                        (ulong)(local_3a0.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != &local_340.field_2) {
        operator_delete(local_340._M_dataplus._M_p,
                        (ulong)(local_340.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) {
        operator_delete(local_360._M_dataplus._M_p,
                        (ulong)(local_360.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p == &local_300.field_2) goto LAB_010400cd;
      uVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT17(local_300.field_2._M_local_buf[7],
                          local_300.field_2._M_allocated_capacity._0_7_);
      _Var13._M_p = local_300._M_dataplus._M_p;
    }
    break;
  case CASETYPE_STATIC_BRANCH:
    local_23c = (uint)(CVar1 == CASESHADERTYPE_VERTEX) * 2 + 2;
    if (optimized) {
      std::operator+(&local_340,"\t",&local_260);
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_340);
      pcVar12 = (char *)(puVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar12) {
        local_3a0.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_3a0.field_2._8_8_ = puVar3[3];
        local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
      }
      else {
        local_3a0.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_3a0._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_3a0._M_string_length = puVar3[1];
      *puVar3 = pcVar12;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      puVar3 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_3a0,(ulong)local_260._M_dataplus._M_p)
      ;
      pcVar12 = (char *)(puVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar12) {
        local_380.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_380.field_2._8_8_ = puVar3[3];
        local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
      }
      else {
        local_380.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_380._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_380._M_string_length = puVar3[1];
      *puVar3 = pcVar12;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_380);
      paVar5 = &local_1a8[0].field_2;
      plVar7 = plVar4 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar7) {
        local_1a8[0].field_2._0_8_ = *plVar7;
        local_1a8[0].field_2._8_8_ = plVar4[3];
        local_1a8[0]._M_dataplus._M_p = (pointer)paVar5;
      }
      else {
        local_1a8[0].field_2._0_8_ = *plVar7;
        local_1a8[0]._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_1a8[0]._M_string_length = plVar4[1];
      *plVar4 = (long)plVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      local_300.field_2._M_allocated_capacity._0_7_ = 0x2065756c617609;
      local_300.field_2._M_local_buf[7] = '+';
      local_300.field_2._8_7_ = 0xa3b622a61203d;
      local_300._M_string_length = 0xf;
      local_300.field_2._M_local_buf[0xf] = '\0';
      local_320._M_string_length = 0;
      local_320.field_2._M_local_buf[0] = '\0';
      local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
      local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
      repeat(&local_360,&local_300,local_23c,&local_320);
      uVar6 = (undefined1 *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != paVar5) {
        uVar6 = local_1a8[0].field_2._M_allocated_capacity;
      }
      if ((ulong)uVar6 < (undefined1 *)(local_360._M_string_length + local_1a8[0]._M_string_length))
      {
        uVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          uVar6 = local_360.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar6 <
            (undefined1 *)(local_360._M_string_length + local_1a8[0]._M_string_length))
        goto LAB_0103f2c9;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_360,0,(char *)0x0,(ulong)local_1a8[0]._M_dataplus._M_p);
      }
      else {
LAB_0103f2c9:
        puVar3 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)local_1a8,(ulong)local_360._M_dataplus._M_p);
      }
      local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
      puVar8 = puVar3 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_2e0.field_2._M_allocated_capacity = *puVar8;
        local_2e0.field_2._8_8_ = puVar3[3];
      }
      else {
        local_2e0.field_2._M_allocated_capacity = *puVar8;
        local_2e0._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_2e0._M_string_length = puVar3[1];
      *puVar3 = puVar8;
      puVar3[1] = 0;
      *(undefined1 *)puVar8 = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) {
        operator_delete(local_360._M_dataplus._M_p,
                        (ulong)(local_360.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p,
                        CONCAT17(local_320.field_2._M_local_buf[7],
                                 CONCAT61(local_320.field_2._M_allocated_capacity._1_6_,
                                          local_320.field_2._M_local_buf[0])) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,
                        CONCAT17(local_300.field_2._M_local_buf[7],
                                 local_300.field_2._M_allocated_capacity._0_7_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != paVar5) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,
                        (ulong)(local_1a8[0].field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._M_dataplus._M_p != &local_380.field_2) {
        operator_delete(local_380._M_dataplus._M_p,
                        (ulong)(local_380.field_2._M_allocated_capacity + 1));
      }
      uVar6 = local_3a0.field_2._M_allocated_capacity;
      _Var13._M_p = local_3a0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p == &local_3a0.field_2) goto LAB_0103ffa5;
LAB_0103ff9d:
      operator_delete(_Var13._M_p,(ulong)(uVar6 + 1));
      goto LAB_0103ffa5;
    }
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    local_2e0._M_string_length = 0;
    local_2e0.field_2._M_allocated_capacity =
         local_2e0.field_2._M_allocated_capacity & 0xffffffffffffff00;
    paVar5 = &local_340.field_2;
    uVar14 = 0;
    do {
      std::operator+(&local_1d8,"\t",&local_260);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_1d8);
      local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
      plVar7 = plVar4 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar7) {
        local_280.field_2._M_allocated_capacity = *plVar7;
        local_280.field_2._8_8_ = plVar4[3];
      }
      else {
        local_280.field_2._M_allocated_capacity = *plVar7;
        local_280._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_280._M_string_length = plVar4[1];
      *plVar4 = (long)plVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::ostream::operator<<(local_1a8,uVar14);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar6 = (undefined8 *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        uVar6 = local_280.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar6 < (undefined8 *)(local_1f0 + local_280._M_string_length)) {
        puVar3 = (undefined8 *)0xf;
        if (local_1f8 != local_1e8) {
          puVar3 = local_1e8[0];
        }
        if (puVar3 < (undefined8 *)(local_1f0 + local_280._M_string_length)) goto LAB_0103d8b4;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_1f8,0,(char *)0x0,(ulong)local_280._M_dataplus._M_p);
      }
      else {
LAB_0103d8b4:
        puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_280,(ulong)local_1f8);
      }
      local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
      pcVar12 = (char *)(puVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar12) {
        local_2c0.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_2c0.field_2._8_8_ = puVar3[3];
      }
      else {
        local_2c0.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_2c0._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_2c0._M_string_length = puVar3[1];
      *puVar3 = pcVar12;
      puVar3[1] = 0;
      *pcVar12 = '\0';
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_2c0);
      local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
      pcVar12 = (char *)(puVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar12) {
        local_2a0.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_2a0.field_2._8_8_ = puVar3[3];
      }
      else {
        local_2a0.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_2a0._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_2a0._M_string_length = puVar3[1];
      *puVar3 = pcVar12;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_2a0,(ulong)local_260._M_dataplus._M_p);
      local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
      plVar7 = plVar4 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar7) {
        lVar2 = *plVar7;
        local_320.field_2._M_local_buf[0] = (char)lVar2;
        local_320.field_2._M_allocated_capacity._1_6_ = (undefined6)((ulong)lVar2 >> 8);
        local_320.field_2._M_local_buf[7] = (char)((ulong)lVar2 >> 0x38);
        local_320.field_2._8_7_ = (undefined7)plVar4[3];
        local_320.field_2._M_local_buf[0xf] = (char)((ulong)plVar4[3] >> 0x38);
      }
      else {
        lVar2 = *plVar7;
        local_320.field_2._M_local_buf[0] = (char)lVar2;
        local_320.field_2._M_allocated_capacity._1_6_ = (undefined6)((ulong)lVar2 >> 8);
        local_320.field_2._M_local_buf[7] = (char)((ulong)lVar2 >> 0x38);
        local_320._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_320._M_string_length = plVar4[1];
      *plVar4 = (long)plVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_320);
      local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
      pcVar12 = (char *)(puVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar12) {
        local_300.field_2._M_allocated_capacity._0_7_ = (undefined7)*(undefined8 *)pcVar12;
        local_300.field_2._M_local_buf[7] = (char)((ulong)*(undefined8 *)pcVar12 >> 0x38);
        local_300.field_2._8_7_ = (undefined7)puVar3[3];
        local_300.field_2._M_local_buf[0xf] = (char)((ulong)puVar3[3] >> 0x38);
      }
      else {
        local_300.field_2._M_allocated_capacity._0_7_ = (undefined7)*(undefined8 *)pcVar12;
        local_300.field_2._M_local_buf[7] = (char)((ulong)*(undefined8 *)pcVar12 >> 0x38);
        local_300._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_300._M_string_length = puVar3[1];
      *puVar3 = pcVar12;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::ostream::operator<<(local_1a8,uVar14);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        uVar11 = CONCAT17(local_300.field_2._M_local_buf[7],
                          local_300.field_2._M_allocated_capacity._0_7_);
      }
      if (uVar11 < local_210 + local_300._M_string_length) {
        uVar11 = 0xf;
        if (local_218 != local_208) {
          uVar11 = local_208[0];
        }
        if (uVar11 < local_210 + local_300._M_string_length) goto LAB_0103db16;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_218,0,(char *)0x0,(ulong)local_300._M_dataplus._M_p);
      }
      else {
LAB_0103db16:
        puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_218);
      }
      local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
      psVar9 = puVar3 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_360.field_2._M_allocated_capacity = *psVar9;
        local_360.field_2._8_8_ = puVar3[3];
      }
      else {
        local_360.field_2._M_allocated_capacity = *psVar9;
        local_360._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_360._M_string_length = puVar3[1];
      *puVar3 = psVar9;
      puVar3[1] = 0;
      *(undefined1 *)psVar9 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_360);
      puVar8 = (ulong *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_340.field_2._M_allocated_capacity = *puVar8;
        local_340.field_2._8_8_ = plVar4[3];
        local_340._M_dataplus._M_p = (pointer)paVar5;
      }
      else {
        local_340.field_2._M_allocated_capacity = *puVar8;
        local_340._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_340._M_string_length = plVar4[1];
      *plVar4 = (long)puVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::ostream::operator<<(local_1a8,uVar14);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar6 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != paVar5) {
        uVar6 = local_340.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar6 < local_230 + local_340._M_string_length) {
        uVar11 = 0xf;
        if (local_238 != local_228) {
          uVar11 = local_228[0];
        }
        if (uVar11 < local_230 + local_340._M_string_length) goto LAB_0103dc67;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_238,0,(char *)0x0,(ulong)local_340._M_dataplus._M_p);
      }
      else {
LAB_0103dc67:
        puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_340,(ulong)local_238);
      }
      local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
      psVar9 = puVar3 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_3a0.field_2._M_allocated_capacity = *psVar9;
        local_3a0.field_2._8_8_ = puVar3[3];
      }
      else {
        local_3a0.field_2._M_allocated_capacity = *psVar9;
        local_3a0._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_3a0._M_string_length = puVar3[1];
      *puVar3 = psVar9;
      puVar3[1] = 0;
      *(undefined1 *)psVar9 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_3a0);
      local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
      psVar9 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_380.field_2._M_allocated_capacity = *psVar9;
        local_380.field_2._8_8_ = plVar4[3];
      }
      else {
        local_380.field_2._M_allocated_capacity = *psVar9;
        local_380._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_380._M_string_length = plVar4[1];
      *plVar4 = (long)psVar9;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_380._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._M_dataplus._M_p != &local_380.field_2) {
        operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
        operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
      }
      if (local_238 != local_228) {
        operator_delete(local_238,local_228[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != paVar5) {
        operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) {
        operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
      }
      if (local_218 != local_208) {
        operator_delete(local_218,local_208[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,
                        CONCAT17(local_300.field_2._M_local_buf[7],
                                 local_300.field_2._M_allocated_capacity._0_7_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p,
                        CONCAT17(local_320.field_2._M_local_buf[7],
                                 CONCAT61(local_320.field_2._M_allocated_capacity._1_6_,
                                          local_320.field_2._M_local_buf[0])) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
        operator_delete(local_2a0._M_dataplus._M_p,
                        (ulong)(local_2a0.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        operator_delete(local_2c0._M_dataplus._M_p,
                        (ulong)(local_2c0.field_2._M_allocated_capacity + 1));
      }
      if (local_1f8 != local_1e8) {
        operator_delete(local_1f8,(ulong)((long)local_1e8[0] + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        operator_delete(local_280._M_dataplus._M_p,
                        (ulong)(local_280.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,
                        CONCAT62(local_1d8.field_2._M_allocated_capacity._2_6_,
                                 local_1d8.field_2._M_allocated_capacity._0_2_) + 1);
      }
      if (uVar14 % 3 == 2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::ostream::operator<<(local_1a8,uVar14);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_300,0,(char *)0x0,0x1c2b5c2);
        local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
        psVar9 = puVar3 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_360.field_2._M_allocated_capacity = *psVar9;
          local_360.field_2._8_8_ = puVar3[3];
        }
        else {
          local_360.field_2._M_allocated_capacity = *psVar9;
          local_360._M_dataplus._M_p = (pointer)*puVar3;
        }
        local_360._M_string_length = puVar3[1];
        *puVar3 = psVar9;
        puVar3[1] = 0;
        *(undefined1 *)(puVar3 + 2) = 0;
        puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_360);
        puVar8 = puVar3 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar8) {
          local_340.field_2._M_allocated_capacity = *puVar8;
          local_340.field_2._8_8_ = puVar3[3];
          local_340._M_dataplus._M_p = (pointer)paVar5;
        }
        else {
          local_340.field_2._M_allocated_capacity = *puVar8;
          local_340._M_dataplus._M_p = (pointer)*puVar3;
        }
        local_340._M_string_length = puVar3[1];
        *puVar3 = puVar8;
        puVar3[1] = 0;
        *(undefined1 *)(puVar3 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::ostream::operator<<(local_1a8,uVar14);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        uVar6 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_dataplus._M_p != paVar5) {
          uVar6 = local_340.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar6 < local_320._M_string_length + local_340._M_string_length) {
          uVar11 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_320._M_dataplus._M_p != &local_320.field_2) {
            uVar11 = CONCAT17(local_320.field_2._M_local_buf[7],
                              CONCAT61(local_320.field_2._M_allocated_capacity._1_6_,
                                       local_320.field_2._M_local_buf[0]));
          }
          if (uVar11 < local_320._M_string_length + local_340._M_string_length) goto LAB_0103e349;
          puVar3 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_320,0,(char *)0x0,(ulong)local_340._M_dataplus._M_p);
        }
        else {
LAB_0103e349:
          puVar3 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_340,(ulong)local_320._M_dataplus._M_p);
        }
        local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
        psVar9 = puVar3 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_3a0.field_2._M_allocated_capacity = *psVar9;
          local_3a0.field_2._8_8_ = puVar3[3];
        }
        else {
          local_3a0.field_2._M_allocated_capacity = *psVar9;
          local_3a0._M_dataplus._M_p = (pointer)*puVar3;
        }
        local_3a0._M_string_length = puVar3[1];
        *puVar3 = psVar9;
        puVar3[1] = 0;
        *(undefined1 *)psVar9 = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_3a0);
        local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
        psVar9 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_380.field_2._M_allocated_capacity = *psVar9;
          local_380.field_2._8_8_ = plVar4[3];
        }
        else {
          local_380.field_2._M_allocated_capacity = *psVar9;
          local_380._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_380._M_string_length = plVar4[1];
        *plVar4 = (long)psVar9;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_380._M_dataplus._M_p);
      }
      else if (uVar14 % 3 == 1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::ostream::operator<<(local_1a8,uVar14);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_300,0,(char *)0x0,0x1c2b5b6);
        local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
        psVar9 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_360.field_2._M_allocated_capacity = *psVar9;
          local_360.field_2._8_8_ = plVar4[3];
        }
        else {
          local_360.field_2._M_allocated_capacity = *psVar9;
          local_360._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_360._M_string_length = plVar4[1];
        *plVar4 = (long)psVar9;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_360);
        puVar8 = (ulong *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar8) {
          local_340.field_2._M_allocated_capacity = *puVar8;
          local_340.field_2._8_8_ = plVar4[3];
          local_340._M_dataplus._M_p = (pointer)paVar5;
        }
        else {
          local_340.field_2._M_allocated_capacity = *puVar8;
          local_340._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_340._M_string_length = plVar4[1];
        *plVar4 = (long)puVar8;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::ostream::operator<<(local_1a8,uVar14);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        uVar6 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_dataplus._M_p != paVar5) {
          uVar6 = local_340.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar6 < local_320._M_string_length + local_340._M_string_length) {
          uVar11 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_320._M_dataplus._M_p != &local_320.field_2) {
            uVar11 = CONCAT17(local_320.field_2._M_local_buf[7],
                              CONCAT61(local_320.field_2._M_allocated_capacity._1_6_,
                                       local_320.field_2._M_local_buf[0]));
          }
          if (uVar11 < local_320._M_string_length + local_340._M_string_length) goto LAB_0103e281;
          puVar3 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_320,0,(char *)0x0,(ulong)local_340._M_dataplus._M_p);
        }
        else {
LAB_0103e281:
          puVar3 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_340,(ulong)local_320._M_dataplus._M_p);
        }
        local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
        psVar9 = puVar3 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_3a0.field_2._M_allocated_capacity = *psVar9;
          local_3a0.field_2._8_8_ = puVar3[3];
        }
        else {
          local_3a0.field_2._M_allocated_capacity = *psVar9;
          local_3a0._M_dataplus._M_p = (pointer)*puVar3;
        }
        local_3a0._M_string_length = puVar3[1];
        *puVar3 = psVar9;
        puVar3[1] = 0;
        *(undefined1 *)psVar9 = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_3a0);
        local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
        psVar9 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_380.field_2._M_allocated_capacity = *psVar9;
          local_380.field_2._8_8_ = plVar4[3];
        }
        else {
          local_380.field_2._M_allocated_capacity = *psVar9;
          local_380._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_380._M_string_length = plVar4[1];
        *plVar4 = (long)psVar9;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_380._M_dataplus._M_p);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::ostream::operator<<(local_1a8,uVar14);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_300,0,(char *)0x0,0x1c2b5a9);
        local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
        psVar9 = puVar3 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_360.field_2._M_allocated_capacity = *psVar9;
          local_360.field_2._8_8_ = puVar3[3];
        }
        else {
          local_360.field_2._M_allocated_capacity = *psVar9;
          local_360._M_dataplus._M_p = (pointer)*puVar3;
        }
        local_360._M_string_length = puVar3[1];
        *puVar3 = psVar9;
        puVar3[1] = 0;
        *(undefined1 *)(puVar3 + 2) = 0;
        puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_360);
        puVar8 = puVar3 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar8) {
          local_340.field_2._M_allocated_capacity = *puVar8;
          local_340.field_2._8_8_ = puVar3[3];
          local_340._M_dataplus._M_p = (pointer)paVar5;
        }
        else {
          local_340.field_2._M_allocated_capacity = *puVar8;
          local_340._M_dataplus._M_p = (pointer)*puVar3;
        }
        local_340._M_string_length = puVar3[1];
        *puVar3 = puVar8;
        puVar3[1] = 0;
        *(undefined1 *)(puVar3 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::ostream::operator<<(local_1a8,uVar14);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        uVar6 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_dataplus._M_p != paVar5) {
          uVar6 = local_340.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar6 < local_320._M_string_length + local_340._M_string_length) {
          uVar11 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_320._M_dataplus._M_p != &local_320.field_2) {
            uVar11 = CONCAT17(local_320.field_2._M_local_buf[7],
                              CONCAT61(local_320.field_2._M_allocated_capacity._1_6_,
                                       local_320.field_2._M_local_buf[0]));
          }
          if (uVar11 < local_320._M_string_length + local_340._M_string_length) goto LAB_0103e411;
          puVar3 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_320,0,(char *)0x0,(ulong)local_340._M_dataplus._M_p);
        }
        else {
LAB_0103e411:
          puVar3 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_340,(ulong)local_320._M_dataplus._M_p);
        }
        local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
        psVar9 = puVar3 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_3a0.field_2._M_allocated_capacity = *psVar9;
          local_3a0.field_2._8_8_ = puVar3[3];
        }
        else {
          local_3a0.field_2._M_allocated_capacity = *psVar9;
          local_3a0._M_dataplus._M_p = (pointer)*puVar3;
        }
        local_3a0._M_string_length = puVar3[1];
        *puVar3 = psVar9;
        puVar3[1] = 0;
        *(undefined1 *)psVar9 = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_3a0);
        local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
        psVar9 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_380.field_2._M_allocated_capacity = *psVar9;
          local_380.field_2._8_8_ = plVar4[3];
        }
        else {
          local_380.field_2._M_allocated_capacity = *psVar9;
          local_380._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_380._M_string_length = plVar4[1];
        *plVar4 = (long)psVar9;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_380._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._M_dataplus._M_p != &local_380.field_2) {
        operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
        operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p,
                        CONCAT17(local_320.field_2._M_local_buf[7],
                                 CONCAT61(local_320.field_2._M_allocated_capacity._1_6_,
                                          local_320.field_2._M_local_buf[0])) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != paVar5) {
        operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) {
        operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,
                        CONCAT17(local_300.field_2._M_local_buf[7],
                                 local_300.field_2._M_allocated_capacity._0_7_) + 1);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::ostream::operator<<(local_1a8,uVar14);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_300,0,(char *)0x0,0x1c2b5d9);
      local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
      pcVar12 = (char *)(puVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar12) {
        local_360.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_360.field_2._8_8_ = puVar3[3];
      }
      else {
        local_360.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_360._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_360._M_string_length = puVar3[1];
      *puVar3 = pcVar12;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_360);
      pcVar12 = (char *)(puVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar12) {
        local_340.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_340.field_2._8_8_ = puVar3[3];
        local_340._M_dataplus._M_p = (pointer)paVar5;
      }
      else {
        local_340.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_340._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_340._M_string_length = puVar3[1];
      *puVar3 = pcVar12;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::ostream::operator<<(local_1a8,uVar14);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != paVar5) {
        uVar6 = local_340.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar6 < (char *)(local_340._M_string_length + local_320._M_string_length)) {
        pcVar12 = (char *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != &local_320.field_2) {
          pcVar12 = (char *)CONCAT17(local_320.field_2._M_local_buf[7],
                                     CONCAT61(local_320.field_2._M_allocated_capacity._1_6_,
                                              local_320.field_2._M_local_buf[0]));
        }
        if (pcVar12 < (char *)(local_340._M_string_length + local_320._M_string_length))
        goto LAB_0103e8bf;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_320,0,(char *)0x0,(ulong)local_340._M_dataplus._M_p);
      }
      else {
LAB_0103e8bf:
        puVar3 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_340,(ulong)local_320._M_dataplus._M_p);
      }
      local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
      pcVar12 = (char *)(puVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar12) {
        local_3a0.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_3a0.field_2._8_8_ = puVar3[3];
      }
      else {
        local_3a0.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_3a0._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_3a0._M_string_length = puVar3[1];
      *puVar3 = pcVar12;
      puVar3[1] = 0;
      *pcVar12 = '\0';
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_3a0);
      local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
      pcVar12 = (char *)(puVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar12) {
        local_380.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_380.field_2._8_8_ = puVar3[3];
      }
      else {
        local_380.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_380._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_380._M_string_length = puVar3[1];
      *puVar3 = pcVar12;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_380._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._M_dataplus._M_p != &local_380.field_2) {
        operator_delete(local_380._M_dataplus._M_p,
                        (ulong)(local_380.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
        operator_delete(local_3a0._M_dataplus._M_p,
                        (ulong)(local_3a0.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p,
                        CONCAT17(local_320.field_2._M_local_buf[7],
                                 CONCAT61(local_320.field_2._M_allocated_capacity._1_6_,
                                          local_320.field_2._M_local_buf[0])) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != paVar5) {
        operator_delete(local_340._M_dataplus._M_p,
                        (ulong)(local_340.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) {
        operator_delete(local_360._M_dataplus._M_p,
                        (ulong)(local_360.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,
                        CONCAT17(local_300.field_2._M_local_buf[7],
                                 local_300.field_2._M_allocated_capacity._0_7_) + 1);
      }
      uVar14 = uVar14 + 1;
    } while (local_23c != uVar14);
    local_3a0._M_dataplus._M_p = (pointer)0x1b;
    local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
    local_380._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_380,(ulong)&local_3a0);
    local_380.field_2._M_allocated_capacity = (size_type)local_3a0._M_dataplus._M_p;
    builtin_strncpy((char *)((long)local_380._M_dataplus._M_p + 0xb),"${NDX}*b",8);
    builtin_strncpy((char *)((long)local_380._M_dataplus._M_p + 0x13),"${NDX};\n",8);
    *(undefined8 *)local_380._M_dataplus._M_p = 0x2b2065756c617609;
    *(undefined8 *)((long)local_380._M_dataplus._M_p + 8) = 0x58444e7b2461203d;
    local_380._M_string_length = (size_type)local_3a0._M_dataplus._M_p;
    local_380._M_dataplus._M_p[(long)local_3a0._M_dataplus._M_p] = '\0';
    local_3a0._M_string_length = 0;
    local_3a0.field_2._M_allocated_capacity =
         local_3a0.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
    repeatIndexedTemplate(local_1a8,&local_380,local_23c,&local_3a0,0);
    std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_1a8[0]._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,
                      (ulong)(local_1a8[0].field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p,
                      (ulong)(local_3a0.field_2._M_allocated_capacity + 1));
    }
    uVar6 = local_380.field_2._M_allocated_capacity;
    _Var13._M_p = local_380._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p == &local_380.field_2) goto LAB_010400cd;
    break;
  case CASETYPE_LOOP:
    iVar10 = 4;
    if (CVar1 == CASESHADERTYPE_VERTEX) {
      iVar10 = 0x20;
    }
    if (optimized) {
      std::operator+(&local_340,"\t",&local_260);
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_340);
      pcVar12 = (char *)(puVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar12) {
        local_3a0.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_3a0.field_2._8_8_ = puVar3[3];
        local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
      }
      else {
        local_3a0.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_3a0._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_3a0._M_string_length = puVar3[1];
      *puVar3 = pcVar12;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::ostream::operator<<(local_1a8,iVar10);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
        uVar6 = local_3a0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar6 < (undefined1 *)(local_360._M_string_length + local_3a0._M_string_length)) {
        uVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          uVar6 = local_360.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar6 < (undefined1 *)(local_360._M_string_length + local_3a0._M_string_length))
        goto LAB_0103ee0e;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_360,0,(char *)0x0,(ulong)local_3a0._M_dataplus._M_p);
      }
      else {
LAB_0103ee0e:
        puVar3 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_3a0,(ulong)local_360._M_dataplus._M_p);
      }
      local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
      pcVar12 = (char *)(puVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar12) {
        local_380.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_380.field_2._8_8_ = puVar3[3];
      }
      else {
        local_380.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_380._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_380._M_string_length = puVar3[1];
      *puVar3 = pcVar12;
      puVar3[1] = 0;
      *pcVar12 = '\0';
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_380);
    }
    else {
      std::operator+(&local_2a0,"\t",&local_260);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_2a0);
      plVar7 = plVar4 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar7) {
        lVar2 = *plVar7;
        local_320.field_2._M_local_buf[0] = (char)lVar2;
        local_320.field_2._M_allocated_capacity._1_6_ = (undefined6)((ulong)lVar2 >> 8);
        local_320.field_2._M_local_buf[7] = (char)((ulong)lVar2 >> 0x38);
        local_320.field_2._8_7_ = (undefined7)plVar4[3];
        local_320.field_2._M_local_buf[0xf] = (char)((ulong)plVar4[3] >> 0x38);
        local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
      }
      else {
        lVar2 = *plVar7;
        local_320.field_2._M_local_buf[0] = (char)lVar2;
        local_320.field_2._M_allocated_capacity._1_6_ = (undefined6)((ulong)lVar2 >> 8);
        local_320.field_2._M_local_buf[7] = (char)((ulong)lVar2 >> 0x38);
        local_320._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_320._M_string_length = plVar4[1];
      *plVar4 = (long)plVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::ostream::operator<<(local_1a8,iVar10);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      pcVar12 = (char *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        pcVar12 = (char *)CONCAT17(local_320.field_2._M_local_buf[7],
                                   CONCAT61(local_320.field_2._M_allocated_capacity._1_6_,
                                            local_320.field_2._M_local_buf[0]));
      }
      if (pcVar12 < (char *)(local_2c0._M_string_length + local_320._M_string_length)) {
        uVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
          uVar6 = local_2c0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar6 < (char *)(local_2c0._M_string_length + local_320._M_string_length))
        goto LAB_0103eeed;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_2c0,0,(char *)0x0,(ulong)local_320._M_dataplus._M_p);
      }
      else {
LAB_0103eeed:
        puVar3 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_320,(ulong)local_2c0._M_dataplus._M_p);
      }
      local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
      pcVar12 = (char *)(puVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar12) {
        local_300.field_2._M_allocated_capacity._0_7_ = (undefined7)*(undefined8 *)pcVar12;
        local_300.field_2._M_local_buf[7] = (char)((ulong)*(undefined8 *)pcVar12 >> 0x38);
        local_300.field_2._8_7_ = (undefined7)puVar3[3];
        local_300.field_2._M_local_buf[0xf] = (char)((ulong)puVar3[3] >> 0x38);
      }
      else {
        local_300.field_2._M_allocated_capacity._0_7_ = (undefined7)*(undefined8 *)pcVar12;
        local_300.field_2._M_local_buf[7] = (char)((ulong)*(undefined8 *)pcVar12 >> 0x38);
        local_300._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_300._M_string_length = puVar3[1];
      *puVar3 = pcVar12;
      puVar3[1] = 0;
      *pcVar12 = '\0';
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_300);
      local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
      pcVar12 = (char *)(puVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar12) {
        local_360.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_360.field_2._8_8_ = puVar3[3];
      }
      else {
        local_360.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_360._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_360._M_string_length = puVar3[1];
      *puVar3 = pcVar12;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      puVar3 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_360,(ulong)local_260._M_dataplus._M_p)
      ;
      local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
      pcVar12 = (char *)(puVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar12) {
        local_340.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_340.field_2._8_8_ = puVar3[3];
      }
      else {
        local_340.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_340._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_340._M_string_length = puVar3[1];
      *puVar3 = pcVar12;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_340);
      pcVar12 = (char *)(puVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar12) {
        local_3a0.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_3a0.field_2._8_8_ = puVar3[3];
        local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
      }
      else {
        local_3a0.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_3a0._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_3a0._M_string_length = puVar3[1];
      *puVar3 = pcVar12;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::ostream::operator<<(local_1a8,iVar10);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
        uVar6 = local_3a0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar6 < (undefined8 *)(local_280._M_string_length + local_3a0._M_string_length)) {
        uVar6 = (undefined8 *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          uVar6 = local_280.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar6 < (undefined8 *)(local_280._M_string_length + local_3a0._M_string_length))
        goto LAB_0103fa17;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_280,0,(char *)0x0,(ulong)local_3a0._M_dataplus._M_p);
      }
      else {
LAB_0103fa17:
        puVar3 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_3a0,(ulong)local_280._M_dataplus._M_p);
      }
      local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
      pcVar12 = (char *)(puVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar12) {
        local_380.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_380.field_2._8_8_ = puVar3[3];
      }
      else {
        local_380.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_380._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_380._M_string_length = puVar3[1];
      *puVar3 = pcVar12;
      puVar3[1] = 0;
      *pcVar12 = '\0';
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_380);
    }
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    puVar8 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_2e0.field_2._M_allocated_capacity = *puVar8;
      local_2e0.field_2._8_8_ = puVar3[3];
    }
    else {
      local_2e0.field_2._M_allocated_capacity = *puVar8;
      local_2e0._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_2e0._M_string_length = puVar3[1];
    *puVar3 = puVar8;
    puVar3[1] = 0;
    *(undefined1 *)puVar8 = 0;
    if (!optimized) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._M_dataplus._M_p != &local_380.field_2) {
        operator_delete(local_380._M_dataplus._M_p,
                        (ulong)(local_380.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        operator_delete(local_280._M_dataplus._M_p,
                        (ulong)(local_280.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
        operator_delete(local_3a0._M_dataplus._M_p,
                        (ulong)(local_3a0.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != &local_340.field_2) {
        operator_delete(local_340._M_dataplus._M_p,
                        (ulong)(local_340.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) {
        operator_delete(local_360._M_dataplus._M_p,
                        (ulong)(local_360.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,
                        CONCAT17(local_300.field_2._M_local_buf[7],
                                 local_300.field_2._M_allocated_capacity._0_7_) + 1);
      }
      uVar6 = local_2c0.field_2._M_allocated_capacity;
      _Var13._M_p = local_2c0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) goto LAB_01040083;
      goto LAB_0104008b;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,
                      (ulong)(local_380.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,
                      (ulong)(local_360.field_2._M_allocated_capacity + 1));
    }
    uVar6 = local_3a0.field_2._M_allocated_capacity;
    _Var13._M_p = local_3a0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) goto LAB_0103ff9d;
LAB_0103ffa5:
    uVar6 = local_340.field_2._M_allocated_capacity;
    _Var13._M_p = local_340._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p == &local_340.field_2) goto LAB_010400cd;
    break;
  default:
switchD_0103d58e_default:
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    uVar6 = std::__throw_logic_error("basic_string::_M_construct null not valid");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,
                      (ulong)(local_1a8[0].field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p,
                      (ulong)(local_3a0.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,
                      (ulong)(local_380.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,
                      CONCAT17(local_260.field_2._M_local_buf[7],
                               CONCAT25(local_260.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_260.field_2._M_local_buf[4],
                                                 local_260.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    _Unwind_Resume(uVar6);
  }
  operator_delete(_Var13._M_p,(ulong)(uVar6 + 1));
LAB_010400cd:
  local_1a8[0]._M_string_length = 0;
  local_1a8[0].field_2._M_allocated_capacity =
       local_1a8[0].field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
  defaultProgramData(local_1b8,(local_1b0->super_ShaderOptimizationCase).m_caseShaderType,local_1a8,
                     &local_2e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,
                    CONCAT17(local_260.field_2._M_local_buf[7],
                             CONCAT25(local_260.field_2._M_allocated_capacity._5_2_,
                                      CONCAT14(local_260.field_2._M_local_buf[4],
                                               local_260.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  return local_1b8;
}

Assistant:

ProgramData generateProgramData (bool optimized) const
	{
		const bool		isVertexCase	= m_caseShaderType == CASESHADERTYPE_VERTEX;
		const string	precision		= getShaderPrecision(m_caseShaderType);
		const string	statements		= m_caseType == CASETYPE_SINGLE_STATEMENT		? singleStatementCaseStatements		(optimized, precision, isVertexCase)
										: m_caseType == CASETYPE_MULTIPLE_STATEMENTS	? multipleStatementsCaseStatements	(optimized, precision, isVertexCase)
										: m_caseType == CASETYPE_STATIC_BRANCH			? staticBranchCaseStatements		(optimized, precision, isVertexCase)
										: m_caseType == CASETYPE_LOOP					? loopCaseStatements				(optimized, precision, isVertexCase)
										: DE_NULL;

		return defaultProgramData(m_caseShaderType, statements);
	}